

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::find(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *__return_storage_ptr__,
      fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      *this,unsigned_long *key)

{
  std::mutex::lock((mutex *)this);
  do_find(__return_storage_ptr__,this,key);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

auto find(const key_type& key) -> std::optional<value_type>
    {
        std::lock_guard guard{m_lock};
        return do_find(key);
    }